

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  char **ppcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char *reservedTargets [15];
  undefined8 auStack_88 [15];
  char *local_10;
  
  puVar3 = &DAT_0066b460;
  puVar4 = auStack_88;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  ppcVar1 = std::
            __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (auStack_88,&local_10,name);
  return ppcVar1 != &local_10;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  const char* reservedTargets[] = {
    "all",        "ALL_BUILD", "help",       "install",        "INSTALL",
    "preinstall", "clean",     "edit_cache", "rebuild_cache",  "test",
    "RUN_TESTS",  "package",   "PACKAGE",    "package_source", "ZERO_CHECK"
  };

  return std::find(cmArrayBegin(reservedTargets), cmArrayEnd(reservedTargets),
                   name) != cmArrayEnd(reservedTargets);
}